

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_vendorio.cpp
# Opt level: O2

void __thiscall StreamVendorIo::PrintMoreCoinsNeeded(StreamVendorIo *this,int amount)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->os,"Please insert ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,amount);
  poVar1 = std::operator<<(poVar1," more cents.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void StreamVendorIo::PrintMoreCoinsNeeded(int amount) {
    os << "Please insert " << amount << " more cents." << endl;
}